

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O2

void __thiscall InlineTable_WithMultipleKeys_Test::TestBody(InlineTable_WithMultipleKeys_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<sax_event_t> __l;
  allocator_type local_64e;
  allocator local_64d;
  allocator local_64c;
  allocator local_64b;
  allocator local_64a;
  allocator local_649;
  string local_648;
  string local_628;
  events_aggregator_t handler;
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  string local_5d0;
  string local_5b0;
  string local_590;
  AssertionResult gtest_ar;
  sax_event_t local_518;
  undefined4 local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [40];
  sax_event_t local_468;
  undefined4 local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0 [24];
  undefined8 local_3c8;
  sax_event_t local_3b8;
  undefined4 local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [24];
  undefined8 local_318;
  sax_event_t local_308;
  sax_event_t local_2b0;
  undefined4 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [24];
  undefined8 local_210;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [40];
  istringstream input;
  
  std::__cxx11::string::string
            ((string *)&gtest_ar,"key = {\"key\"=123,\tkey=345 , 123 = \t\'value\' } ",
             (allocator *)&local_648);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&gtest_ar,_S_in);
  std::__cxx11::string::~string((string *)&gtest_ar);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::string::string((string *)&local_648,"key",&local_649);
  sax_event_t::sax_event_t(&local_518,key,&local_648);
  local_4a0 = local_490;
  local_4c0 = 9;
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4a8 = 0;
  local_498 = 0;
  local_490[0] = 0;
  std::__cxx11::string::string((string *)&local_628,"key",&local_64a);
  sax_event_t::sax_event_t(&local_468,key,&local_628);
  local_3f0 = local_3e0;
  local_410 = 0xe;
  local_408 = 0;
  uStack_400 = 0;
  local_3f8 = 0;
  local_3e8 = 0;
  local_3e0[0] = 0;
  local_3c8 = 0x7b;
  std::__cxx11::string::string((string *)&local_590,"key",&local_64b);
  sax_event_t::sax_event_t(&local_3b8,key,&local_590);
  local_340 = local_330;
  local_360 = 0xe;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  local_338 = 0;
  local_330[0] = 0;
  local_318 = 0x159;
  std::__cxx11::string::string((string *)&local_5b0,"123",&local_64c);
  sax_event_t::sax_event_t(&local_308,key,&local_5b0);
  std::__cxx11::string::string((string *)&local_5d0,"value",&local_64d);
  sax_event_t::sax_event_t(&local_2b0,string,&local_5d0);
  local_238 = local_228;
  local_258 = 10;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 0;
  local_230 = 0;
  local_228[0] = 0;
  local_210 = 3;
  local_200 = 2;
  local_1e8 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e0 = local_1d0;
  local_1d8 = 0;
  local_1d0[0] = 0;
  __l._M_len = 0xb;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector(&expected_events,__l,&local_64e);
  lVar1 = 0x370;
  do {
    sax_event_t::~sax_event_t((sax_event_t *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x58);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  testing::internal::
  CmpHelperEQ<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((internal *)&gtest_ar,"expected_events","handler.events",&expected_events,
             &handler.events);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_648);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/inline_table.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_628,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_628);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_648);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&expected_events);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(InlineTable, WithMultipleKeys) {
    std::istringstream input("key = {\"key\"=123,\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 123},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 345},
        {sax_event_t::key, "123"},
        {sax_event_t::string, "value"},
        {sax_event_t::finish_inline_table, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}